

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O3

void __thiscall
duckdb::GroupedAggregateHashTable::InitializePartitionedData(GroupedAggregateHashTable *this)

{
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this_00;
  BufferManager *buffer_manager;
  pointer pLVar1;
  pointer pLVar2;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var3;
  pointer pPVar4;
  idx_t iVar5;
  TupleDataLayout *pTVar6;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> this_01;
  ulong uVar7;
  shared_ptr<duckdb::TupleDataLayout,_true> local_38;
  
  this_00 = &this->partitioned_data;
  if ((this->partitioned_data).
      super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
      .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl !=
      (PartitionedTupleData *)0x0) {
    pPVar4 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             ::operator->(this_00);
    iVar5 = PartitionedTupleData::PartitionCount(pPVar4);
    if (iVar5 == 0) {
      iVar5 = 0xffffffffffffffff;
    }
    else {
      uVar7 = iVar5 >> 1 | iVar5;
      uVar7 = uVar7 >> 2 | uVar7;
      uVar7 = uVar7 >> 4 | uVar7;
      uVar7 = uVar7 >> 8 | uVar7;
      uVar7 = uVar7 >> 0x10 | uVar7;
      iVar5 = *(idx_t *)(&DAT_0133ba90 + ((uVar7 >> 0x20 | uVar7) * 0x3f79d71b4cb0a89 >> 0x3a) * 8);
    }
    if (iVar5 == this->radix_bits) {
      pPVar4 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
               ::operator->(this_00);
      PartitionedTupleData::Reset(pPVar4);
      goto LAB_004689bc;
    }
  }
  buffer_manager = (this->super_BaseAggregateHashTable).buffer_manager;
  pTVar6 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                     (&(this->super_BaseAggregateHashTable).layout_ptr);
  pLVar1 = (pTVar6->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pLVar2 = (pTVar6->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01._M_head_impl = (PartitionedTupleData *)operator_new(0x90);
  local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->super_BaseAggregateHashTable).layout_ptr.internal.
       super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (this->super_BaseAggregateHashTable).layout_ptr.internal.
       super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.internal.
            super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_38.internal.
            super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  RadixPartitionedTupleData::RadixPartitionedTupleData
            ((RadixPartitionedTupleData *)this_01._M_head_impl,buffer_manager,&local_38,
             this->radix_bits,((long)pLVar1 - (long)pLVar2 >> 3) * -0x5555555555555555 - 1);
  if (local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_38.internal.
               super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  _Var3._M_head_impl =
       (this_00->
       super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
       .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
  (this_00->
  super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
  .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl = this_01._M_head_impl;
  if (_Var3._M_head_impl != (PartitionedTupleData *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_PartitionedTupleData + 8))();
  }
LAB_004689bc:
  pPVar4 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator->(this_00);
  PartitionedTupleData::InitializeAppendState
            (pPVar4,&(this->state).partitioned_append_state,KEEP_EVERYTHING_PINNED);
  return;
}

Assistant:

void GroupedAggregateHashTable::InitializePartitionedData() {
	if (!partitioned_data ||
	    RadixPartitioning::RadixBitsOfPowerOfTwo(partitioned_data->PartitionCount()) != radix_bits) {
		D_ASSERT(!partitioned_data || partitioned_data->Count() == 0);
		partitioned_data =
		    make_uniq<RadixPartitionedTupleData>(buffer_manager, layout_ptr, radix_bits, layout_ptr->ColumnCount() - 1);
	} else {
		partitioned_data->Reset();
	}

	D_ASSERT(GetLayout().GetAggrWidth() == layout_ptr->GetAggrWidth());
	D_ASSERT(GetLayout().GetDataWidth() == layout_ptr->GetDataWidth());
	D_ASSERT(GetLayout().GetRowWidth() == layout_ptr->GetRowWidth());

	partitioned_data->InitializeAppendState(state.partitioned_append_state,
	                                        TupleDataPinProperties::KEEP_EVERYTHING_PINNED);
}